

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O0

void __thiscall
nv::SlowCompressor::compressDXT1a
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Color32 *pCVar4;
  scalar r;
  scalar g;
  scalar b;
  undefined1 local_598 [8];
  ColourSet colours;
  Color32 local_23c;
  uint local_238;
  byte local_232;
  byte local_231;
  uint i;
  bool allAlpha;
  uint uStack_22c;
  bool anyAlpha;
  uint x;
  uint y;
  WeightedClusterFit fit;
  BlockDXT1 local_70;
  BlockDXT1 block;
  ColorBlock rgba;
  uint h;
  uint w;
  Private *outputOptions_local;
  Private *compressionOptions_local;
  SlowCompressor *this_local;
  
  uVar2 = Image::width(this->m_image);
  uVar3 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&block);
  BlockDXT1::BlockDXT1(&local_70);
  squish::WeightedClusterFit::WeightedClusterFit((WeightedClusterFit *)&x);
  r = Vector4::x(&compressionOptions->colorWeight);
  g = Vector4::y(&compressionOptions->colorWeight);
  b = Vector4::z(&compressionOptions->colorWeight);
  squish::WeightedClusterFit::SetMetric((WeightedClusterFit *)&x,r,g,b);
  uStack_22c = 0;
  do {
    if (uVar3 <= uStack_22c) {
      return;
    }
    for (i = 0; i < uVar2; i = i + 4) {
      ColorBlock::init((ColorBlock *)&block,(EVP_PKEY_CTX *)this->m_image);
      local_231 = 0;
      local_232 = 1;
      for (local_238 = 0; local_238 < 0x10; local_238 = local_238 + 1) {
        pCVar4 = ColorBlock::color((ColorBlock *)&block,local_238);
        if ((pCVar4->field_0).field_0.a < 0x80) {
          local_231 = 1;
        }
        else {
          local_232 = 0;
        }
      }
      if ((local_231 & 1) == 0) {
        bVar1 = ColorBlock::isSingleColor((ColorBlock *)&block);
        if (!bVar1) goto LAB_002aab5a;
LAB_002aab63:
        pCVar4 = ColorBlock::color((ColorBlock *)&block,0);
        Color32::Color32(&local_23c,pCVar4);
        OptimalCompress::compressDXT1a(&local_23c,&local_70);
      }
      else {
LAB_002aab5a:
        if ((local_232 & 1) != 0) goto LAB_002aab63;
        pCVar4 = ColorBlock::colors((ColorBlock *)&block);
        squish::ColourSet::ColourSet((ColourSet *)local_598,(u8 *)pCVar4,0x81,false);
        squish::WeightedClusterFit::SetColourSet((WeightedClusterFit *)&x,(ColourSet *)local_598,1);
        squish::ColourFit::Compress((ColourFit *)&x,&local_70);
      }
      if (outputOptions->outputHandler != (OutputHandler *)0x0) {
        (*outputOptions->outputHandler->_vptr_OutputHandler[3])
                  (outputOptions->outputHandler,&local_70,8);
      }
    }
    uStack_22c = uStack_22c + 4;
  } while( true );
}

Assistant:

void nv::SlowCompressor::compressDXT1a(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	squish::WeightedClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			bool anyAlpha = false;
			bool allAlpha = true;
			
			for (uint i = 0; i < 16; i++)
			{
				if (rgba.color(i).a < 128) anyAlpha = true;
				else allAlpha = false;
			}
			
			if ((!anyAlpha && rgba.isSingleColor() || allAlpha))
			{
				OptimalCompress::compressDXT1a(rgba.color(0), &block);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kDxt1|squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, squish::kDxt1);
				fit.Compress(&block);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}